

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRetF.c
# Opt level: O3

void Aig_ManRetimeMark(Aig_Man_t *p)

{
  ulong *puVar1;
  undefined1 *puVar2;
  void *pvVar3;
  long *plVar4;
  long *plVar5;
  Aig_Obj_t *pObj;
  undefined8 *puVar6;
  bool bVar7;
  int iVar8;
  long lVar9;
  Vec_Ptr_t *pVVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  
  lVar9 = (long)p->vObjs->nSize;
  if (0 < lVar9) {
    lVar14 = 0;
    do {
      pvVar3 = p->vObjs->pArray[lVar14];
      if ((pvVar3 != (void *)0x0) && ((*(byte *)((long)pvVar3 + 0x18) & 0x20) != 0)) {
        __assert_fail("pObj->fMarkB == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigRetF.c"
                      ,0x4f,"void Aig_ManRetimeMark(Aig_Man_t *)");
      }
      lVar14 = lVar14 + 1;
    } while (lVar9 != lVar14);
  }
  uVar12 = (ulong)(uint)p->nRegs;
  if (p->nRegs < p->nObjs[2]) {
    lVar9 = 0;
    do {
      if (p->vCis->nSize <= lVar9) goto LAB_006440d1;
      puVar1 = (ulong *)((long)p->vCis->pArray[lVar9] + 0x18);
      *puVar1 = *puVar1 | 0x20;
      lVar9 = lVar9 + 1;
      uVar12 = (ulong)p->nRegs;
    } while (lVar9 < (long)((long)p->nObjs[2] - uVar12));
  }
  if (0 < (int)uVar12) {
    iVar8 = 0;
    do {
      uVar13 = (p->nObjs[3] - (int)uVar12) + iVar8;
      if (((((int)uVar13 < 0) || (p->vCos->nSize <= (int)uVar13)) ||
          (uVar15 = (p->nObjs[2] - (int)uVar12) + iVar8, (int)uVar15 < 0)) ||
         (p->vCis->nSize <= (int)uVar15)) goto LAB_006440d1;
      plVar4 = (long *)p->vCis->pArray[uVar15];
      if (*plVar4 != 0) {
        __assert_fail("pObjLo->pNext == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigRetF.c"
                      ,0x55,"void Aig_ManRetimeMark(Aig_Man_t *)");
      }
      plVar5 = (long *)p->vCos->pArray[uVar13];
      if (*plVar5 != 0) {
        __assert_fail("pObjLi->pNext == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigRetF.c"
                      ,0x56,"void Aig_ManRetimeMark(Aig_Man_t *)");
      }
      *plVar4 = (long)plVar5;
      *plVar5 = (long)plVar4;
      iVar8 = iVar8 + 1;
      uVar12 = (ulong)(uint)p->nRegs;
    } while (iVar8 < p->nRegs);
  }
  do {
    Aig_ManIncrementTravId(p);
    pVVar10 = p->vCos;
    if (pVVar10->nSize < 1) break;
    lVar9 = 0;
    bVar7 = false;
    do {
      pObj = (Aig_Obj_t *)pVVar10->pArray[lVar9];
      if (((pObj->field_0x18 & 0x20) == 0) && (iVar8 = Aig_ManRetimeMark_rec(p,pObj), iVar8 != 0)) {
        bVar7 = true;
        if ((pObj->field_0).pNext != (Aig_Obj_t *)0x0) {
          puVar2 = &((pObj->field_0).pNext)->field_0x18;
          *puVar2 = *puVar2 | 0x20;
        }
      }
      lVar9 = lVar9 + 1;
      pVVar10 = p->vCos;
    } while (lVar9 < pVVar10->nSize);
  } while (bVar7);
  iVar8 = p->nRegs;
  if (0 < iVar8) {
    iVar11 = 0;
    do {
      uVar13 = (p->nObjs[3] - iVar8) + iVar11;
      if ((((int)uVar13 < 0) || (p->vCos->nSize <= (int)uVar13)) ||
         ((uVar15 = (p->nObjs[2] - iVar8) + iVar11, (int)uVar15 < 0 ||
          (p->vCis->nSize <= (int)uVar15)))) {
LAB_006440d1:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      puVar6 = (undefined8 *)p->vCis->pArray[uVar15];
      *(undefined8 *)p->vCos->pArray[uVar13] = 0;
      *puVar6 = 0;
      iVar11 = iVar11 + 1;
      iVar8 = p->nRegs;
    } while (iVar11 < iVar8);
  }
  return;
}

Assistant:

void Aig_ManRetimeMark( Aig_Man_t * p )
{
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    int fChange, i;
    // mark the PIs
    Aig_ManForEachObj( p, pObj, i )
        assert( pObj->fMarkB == 0 );
    Aig_ManForEachPiSeq( p, pObj, i )
        pObj->fMarkB = 1;
    // map registers into each other
    Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
    {
        assert( pObjLo->pNext == NULL );
        assert( pObjLi->pNext == NULL );
        pObjLo->pNext = pObjLi;
        pObjLi->pNext = pObjLo;
    }
    // iterativively mark the logic reachable from PIs
    fChange = 1;
    while ( fChange )
    {
        fChange = 0;
        Aig_ManIncrementTravId( p );
        Aig_ManForEachCo( p, pObj, i )
        {
            if ( pObj->fMarkB )
                continue;
            if ( Aig_ManRetimeMark_rec( p, pObj ) )
            {
                if ( pObj->pNext )
                    pObj->pNext->fMarkB = 1;
                fChange = 1;
            }
        }
    }
    // clean register mapping
    Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
        pObjLo->pNext = pObjLi->pNext = NULL;
}